

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall
SQCompilation::CheckerVisitor::hasDynamicContent(CheckerVisitor *this,SQObject *container)

{
  int *in_RSI;
  SQObjectPtr *in_RDI;
  SQObjectPtr val;
  SQObjectPtr key;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  SQVM *in_stack_ffffffffffffffb8;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  SQTable *in_stack_ffffffffffffffc8;
  bool local_1;
  
  if (*in_RSI == 0xa000020) {
    SQCompilationContext::getVm((SQCompilationContext *)in_RDI[1].super_SQObject._unVal.pTable);
    ::SQObjectPtr::SQObjectPtr
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(SQChar *)in_RDI,
               CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    ::SQObjectPtr::SQObjectPtr(in_RDI);
    local_1 = SQTable::Get(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                           (SQObjectPtr *)in_stack_ffffffffffffffb8);
    ::SQObjectPtr::~SQObjectPtr(in_RDI);
    ::SQObjectPtr::~SQObjectPtr(in_RDI);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CheckerVisitor::hasDynamicContent(const SQObject &container) {
  if (!sq_istable(container))
    return false;
  SQObjectPtr key(_ctx.getVm(), "__dynamic_content__");
  SQObjectPtr val;
  return _table(container)->Get(key, val);
}